

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void icu_63::number::impl::PatternParser::parseToExistingPropertiesImpl
               (UnicodeString *pattern,DecimalFormatProperties *properties,
               IgnoreRounding ignoreRounding,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  undefined1 local_1f0 [8];
  ParsedPatternInfo patternInfo;
  UErrorCode *status_local;
  IgnoreRounding ignoreRounding_local;
  DecimalFormatProperties *properties_local;
  UnicodeString *pattern_local;
  
  patternInfo._448_8_ = status;
  iVar2 = UnicodeString::length(pattern);
  if (iVar2 == 0) {
    DecimalFormatProperties::clear(properties);
  }
  else {
    ParsedPatternInfo::ParsedPatternInfo((ParsedPatternInfo *)local_1f0);
    parseToPatternInfo(pattern,(ParsedPatternInfo *)local_1f0,(UErrorCode *)patternInfo._448_8_);
    UVar1 = ::U_FAILURE(*(UErrorCode *)patternInfo._448_8_);
    if (UVar1 == '\0') {
      patternInfoToProperties
                (properties,(ParsedPatternInfo *)local_1f0,ignoreRounding,
                 (UErrorCode *)patternInfo._448_8_);
    }
    ParsedPatternInfo::~ParsedPatternInfo((ParsedPatternInfo *)local_1f0);
  }
  return;
}

Assistant:

void PatternParser::parseToExistingPropertiesImpl(const UnicodeString& pattern,
                                                  DecimalFormatProperties& properties,
                                                  IgnoreRounding ignoreRounding, UErrorCode& status) {
    if (pattern.length() == 0) {
        // Backwards compatibility requires that we reset to the default values.
        // TODO: Only overwrite the properties that "saveToProperties" normally touches?
        properties.clear();
        return;
    }

    ParsedPatternInfo patternInfo;
    parseToPatternInfo(pattern, patternInfo, status);
    if (U_FAILURE(status)) { return; }
    patternInfoToProperties(properties, patternInfo, ignoreRounding, status);
}